

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue178_test.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::Key2_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int i)

{
  string local_30;
  
  Key1_abi_cxx11_(&local_30,this,i);
  std::operator+(__return_storage_ptr__,&local_30,"_xxx");
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string Key2(int i) { return Key1(i) + "_xxx"; }